

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

uint __thiscall
Assimp::StreamReader<false,_false>::SetReadLimit(StreamReader<false,_false> *this,uint _limit)

{
  int8_t *piVar1;
  DeadlyImportError *this_00;
  int8_t *piVar2;
  allocator local_39;
  string local_38;
  
  piVar1 = this->limit;
  if (_limit == 0xffffffff) {
    this->limit = this->end;
  }
  else {
    piVar2 = this->buffer + _limit;
    this->limit = piVar2;
    if (this->end < piVar2) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_38,"StreamReader: Invalid read limit",&local_39)
      ;
      DeadlyImportError::DeadlyImportError(this_00,&local_38);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (int)piVar1 - (int)this->buffer;
}

Assistant:

unsigned int GetReadLimit() const    {
        return (unsigned int)(limit - buffer);
    }